

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O2

FrameList_ * __thiscall rw::FrameList_::streamRead(FrameList_ *this,Stream *stream)

{
  byte *pbVar1;
  FILE *pFVar2;
  bool bVar3;
  int32 iVar4;
  Frame **ppFVar5;
  ulong uVar6;
  Frame *child;
  char *pcVar7;
  int32 i;
  long lVar8;
  FrameStreamData buf;
  
  this->numFrames = 0;
  this->frames = (Frame **)0x0;
  bVar3 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar3) {
    iVar4 = Stream::readI32(stream);
    this->numFrames = iVar4;
    allocLocation =
         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/frame.cpp line: 377"
    ;
    ppFVar5 = (Frame **)(*Engine::memfuncs)((long)iVar4 << 3,0x3000e);
    this->frames = ppFVar5;
    if (ppFVar5 == (Frame **)0x0) {
      buf.right.x = 1.96182e-44;
      buf.right.y = -2.8026e-45;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/frame.cpp",0x17b);
      pFVar2 = _stderr;
      pcVar7 = dbgsprint(0x80000002,(long)this->numFrames << 3);
      fprintf(pFVar2,"%s\n",pcVar7);
      setError((Error *)&buf);
LAB_00106edd:
      this = (FrameList_ *)0x0;
    }
    else {
      for (lVar8 = 0; uVar6 = (ulong)this->numFrames, lVar8 < (long)uVar6; lVar8 = lVar8 + 1) {
        Stream::read32(stream,&buf,0x38);
        child = Frame::create();
        this->frames[lVar8] = child;
        if (child == (Frame *)0x0) {
          (*DAT_00144da0)(this->frames);
          goto LAB_00106edd;
        }
        (child->matrix).right.z = buf.right.z;
        (child->matrix).right.x = buf.right.x;
        (child->matrix).right.y = buf.right.y;
        (child->matrix).up.z = buf.up.z;
        (child->matrix).up.x = buf.up.x;
        (child->matrix).up.y = buf.up.y;
        (child->matrix).at.z = buf.at.z;
        (child->matrix).at.x = buf.at.x;
        (child->matrix).at.y = buf.at.y;
        (child->matrix).pos.x = buf.pos.x;
        (child->matrix).pos.y = buf.pos.y;
        (child->matrix).pos.z = buf.pos.z;
        Matrix::optimize(&child->matrix,(Tolerance *)0x0);
        pbVar1 = (byte *)((long)&(child->matrix).flags + 2);
        *pbVar1 = *pbVar1 & 0xfd;
        if (-1 < (long)buf.parent) {
          Frame::addChild(this->frames[buf.parent],child,streamAppendFrames);
        }
      }
      for (lVar8 = 0; lVar8 < (int)uVar6; lVar8 = lVar8 + 1) {
        PluginList::streamRead((PluginList *)&Frame::s_plglist,stream,this->frames[lVar8]);
        uVar6 = (ulong)(uint)this->numFrames;
      }
    }
  }
  else {
    buf.right.x = 1.96182e-44;
    buf.right.y = -5.60519e-45;
    this = (FrameList_ *)0x0;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/frame.cpp",0x175);
    pFVar2 = _stderr;
    pcVar7 = dbgsprint(0x80000004,"STRUCT");
    fprintf(pFVar2,"%s\n",pcVar7);
    setError((Error *)&buf);
  }
  return this;
}

Assistant:

FrameList_*
FrameList_::streamRead(Stream *stream)
{
	FrameStreamData buf;
	this->numFrames = 0;
	this->frames = nil;
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	this->numFrames = stream->readI32();
	this->frames = (Frame**)rwMalloc(this->numFrames*sizeof(Frame*), MEMDUR_EVENT | ID_FRAMELIST);
	if(this->frames == nil){
		RWERROR((ERR_ALLOC, this->numFrames*sizeof(Frame*)));
		return nil;
	}
	for(int32 i = 0; i < this->numFrames; i++){
		Frame *f;
		stream->read32(&buf, sizeof(buf));
		this->frames[i] = f = Frame::create();
		if(f == nil){
			// TODO: clean up frames?
			rwFree(this->frames);
			return nil;
		}
		f->matrix.right = buf.right;
		f->matrix.up = buf.up;
		f->matrix.at = buf.at;
		f->matrix.pos = buf.pos;
		f->matrix.optimize();
		// RW always removes identity flag
		f->matrix.flags &= ~Matrix::IDENTITY;
		if(buf.parent >= 0)
			this->frames[buf.parent]->addChild(f, rw::streamAppendFrames);
	}
	for(int32 i = 0; i < this->numFrames; i++)
		Frame::s_plglist.streamRead(stream, this->frames[i]);
	return this;
}